

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O3

bool __thiscall ComputeM7::Write(ComputeM7 *this,FILE *F_out,char *date,char *version)

{
  pointer pp_Var1;
  _st_m7_algo_count_t *p_Var2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t j;
  bool bVar6;
  
  iVar3 = fprintf((FILE *)F_out,"M7.1,%s,%s, , %6f,\n",this->m71);
  iVar4 = fprintf((FILE *)F_out,"M7.2,%s,%s, , %6f,\n",this->m72,date,version);
  if (iVar3 < 1) {
    return false;
  }
  if (iVar4 < 1) {
    return false;
  }
  uVar5 = 0;
  do {
    pp_Var1 = (this->m7Getter).algo_count.
              super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m7Getter).algo_count.
                      super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3) <= uVar5) {
      uVar5 = 0;
      do {
        pp_Var1 = (this->m7Getter).algo_count.
                  super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar6 = (ulong)((long)(this->m7Getter).algo_count.
                              super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3) <=
                uVar5;
        if (bVar6) {
          return bVar6;
        }
        p_Var2 = pp_Var1[uVar5];
        iVar3 = fprintf((FILE *)F_out,"M7.4,%s,%s, %u, %6f,\n",
                        p_Var2->algo_frequency_cc / (double)(this->m7Getter).nb_cc_tld_queried,date,
                        version,(ulong)p_Var2->algo_code);
        uVar5 = uVar5 + 1;
      } while (0 < iVar3);
      return bVar6;
    }
    p_Var2 = pp_Var1[uVar5];
    iVar3 = fprintf((FILE *)F_out,"M7.3,%s,%s, %u, %6f,\n",
                    p_Var2->algo_frequency / (double)(this->m7Getter).nb_tld_queried,date,version,
                    (ulong)p_Var2->algo_code);
    uVar5 = uVar5 + 1;
  } while (0 < iVar3);
  return false;
}

Assistant:

bool ComputeM7::Write(FILE * F_out, char const* date, char const* version)
{
    bool ret = true;

    ret = (fprintf(F_out, "M7.1,%s,%s, , %6f,\n", date, version, m71) > 0);
    ret &= (fprintf(F_out, "M7.2,%s,%s, , %6f,\n", date, version, m72) > 0);

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency / ((double)m7Getter.nb_tld_queried);
        ret &= (fprintf(F_out, "M7.3,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency_cc / ((double)m7Getter.nb_cc_tld_queried);
        ret &= (fprintf(F_out, "M7.4,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    return ret;
}